

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ustar.c
# Opt level: O0

int format_256(int64_t v,char *p,int s)

{
  int local_1c;
  byte *pbStack_18;
  int s_local;
  char *p_local;
  int64_t v_local;
  
  local_1c = s;
  pbStack_18 = (byte *)(p + s);
  p_local = (char *)v;
  while (0 < local_1c) {
    pbStack_18[-1] = (byte)p_local;
    p_local = (char *)((long)p_local >> 8);
    local_1c = local_1c + -1;
    pbStack_18 = pbStack_18 + -1;
  }
  *pbStack_18 = *pbStack_18 | 0x80;
  return 0;
}

Assistant:

static int
format_256(int64_t v, char *p, int s)
{
	p += s;
	while (s-- > 0) {
		*--p = (char)(v & 0xff);
		v >>= 8;
	}
	*p |= 0x80; /* Set the base-256 marker bit. */
	return (0);
}